

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O1

QString * qt_punycodeDecoder(QString *__return_storage_ptr__,QString *pc)

{
  char16_t cVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  qsizetype qVar10;
  size_type __n;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QLatin1StringView s;
  char32_t local_a4;
  QMessageLogger local_90;
  QString local_70;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)(pc->d).size < 0x40) {
    s.m_data = "xn--";
    s.m_size = 4;
    bVar5 = QString::startsWith(pc,s,CaseSensitive);
    if (bVar5) {
      qVar10 = QString::lastIndexOf(pc,(QChar)0x2d,-1,CaseSensitive);
      local_58.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
      local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._M_dataplus._M_p = (pointer)&DAT_aaaaaaaaaaaaaaaa;
      local_58._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
      iVar17 = (int)qVar10;
      if (iVar17 < 4) {
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0xaaaaaaaa00000000;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        QString::mid(&local_70,pc,(ulong)bVar5 << 2,(ulong)(uint)(iVar17 - (int)((ulong)bVar5 << 2))
                    );
        local_58._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
        local_58.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
        local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::_M_construct(&local_58,local_70.d.size,L'\0');
        if (local_70.d.ptr == (char16_t *)0x0) {
          local_70.d.ptr = L"";
        }
        __n = QString::toUcs4_helper(local_70.d.ptr,local_70.d.size,local_58._M_dataplus._M_p);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::resize(&local_58,__n,L'\0');
      }
      if ((3 < iVar17) && (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0)) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar18 = iVar17 + 1;
      uVar8 = 0x48;
      local_a4 = L'\x80';
      uVar9 = 0;
      do {
        uVar15 = (pc->d).size;
        uVar16 = (uint)uVar15;
        if (uVar16 <= uVar18) {
          QString::fromUcs4(__return_storage_ptr__,local_58._M_dataplus._M_p,
                            local_58._M_string_length);
          break;
        }
        pcVar3 = (pc->d).ptr;
        uVar19 = (ulong)uVar18;
        uVar11 = 1;
        uVar18 = 0x24;
        uVar14 = (ulong)uVar9;
        do {
          cVar1 = pcVar3[uVar19];
          if ((ushort)cVar1 - 0x30 < 10) {
            uVar6 = (ushort)cVar1 - 0x16;
          }
          else {
            uVar6 = (ushort)cVar1 - 0x41;
            if ((0x19 < uVar6) && (uVar6 = (ushort)cVar1 - 0x61, 0x19 < uVar6)) {
              uVar6 = 0x24;
            }
          }
          if (((0x23 < uVar6) ||
              (uVar7 = (uint)(uVar6 * uVar11), (int)(uVar6 * uVar11 >> 0x20) != 0)) ||
             (uVar13 = (uint)uVar14, uVar14 = (ulong)(uVar13 + uVar7), CARRY4(uVar13,uVar7))) {
LAB_00265f65:
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
            (__return_storage_ptr__->d).size = 0;
            iVar17 = 1;
LAB_00265f76:
            bVar5 = false;
          }
          else {
            uVar7 = uVar18 - uVar8;
            if (uVar8 + 0x1a <= uVar18) {
              uVar7 = 0x1a;
            }
            if (uVar18 <= uVar8) {
              uVar7 = 1;
            }
            iVar17 = 0;
            if (uVar6 < uVar7) {
              iVar17 = 4;
              goto LAB_00265f76;
            }
            uVar4 = uVar11 * (0x24 - uVar7);
            bVar5 = true;
            uVar11 = uVar4 & 0xffffffff;
            if ((int)(uVar4 >> 0x20) != 0) goto LAB_00265f65;
          }
          if (!bVar5) {
            uVar18 = (int)uVar19 + 1;
            goto LAB_00265fd4;
          }
          uVar19 = uVar19 + 1;
          uVar18 = uVar18 + 0x24;
        } while ((uVar15 & 0xffffffff) != uVar19);
        iVar17 = 4;
        uVar18 = uVar16;
LAB_00265fd4:
        iVar12 = 0;
        uVar15 = uVar14;
        if (iVar17 == 4) {
          uVar11 = (ulong)((int)local_58._M_string_length + 1);
          uVar8 = 2;
          if (uVar9 == 0) {
            uVar8 = 700;
          }
          uVar15 = (ulong)((int)uVar14 - uVar9) / (ulong)uVar8;
          uVar8 = (int)(uVar15 / uVar11) + (int)uVar15;
          if (0x1c7 < uVar8) {
            iVar12 = 0;
            uVar9 = uVar8;
            do {
              uVar8 = uVar9 / 0x23;
              iVar12 = iVar12 + 0x24;
              bVar5 = 0x3e57 < uVar9;
              uVar9 = uVar8;
            } while (bVar5);
          }
          uVar15 = uVar14 % uVar11;
          uVar8 = (uVar8 * 0x24) / (uVar8 + 0x26) + iVar12;
          uVar9 = (uint)(uVar14 / uVar11);
          bVar5 = CARRY4(local_a4,uVar9);
          local_a4 = local_a4 + uVar9;
          if (bVar5) {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
            (__return_storage_ptr__->d).size = 0;
            iVar12 = 0;
            uVar15 = uVar14;
          }
          else {
            if ((uint)local_a4 < 0x80) {
              local_90.context.version = 2;
              local_90.context._4_8_ = 0;
              local_90.context._12_8_ = 0;
              local_90.context.function._4_4_ = 0;
              local_90.context.category = "default";
              QMessageLogger::warning
                        (&local_90,"Attempt to insert a basic codepoint. Unhandled overflow?");
            }
            else if ((uint)local_a4 < 0x110000 && (local_a4 & 0xfffff800U) != 0xd800) {
              std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::insert
                        (&local_58,uVar15,1,local_a4);
              iVar12 = 1;
              uVar15 = (ulong)((int)uVar15 + 1);
              goto LAB_00266115;
            }
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
            (__return_storage_ptr__->d).size = 0;
            iVar12 = 0;
          }
        }
LAB_00266115:
        uVar9 = (uint)uVar15;
      } while ((char)iVar12 != '\0');
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity * 4 + 4);
      }
    }
    else {
      pDVar2 = (pc->d).d;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (pc->d).ptr;
      (__return_storage_ptr__->d).size = (pc->d).size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0026622a;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0026622a:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Q_AUTOTEST_EXPORT QString qt_punycodeDecoder(const QString &pc)
{
    uint n = initial_n;
    uint i = 0;
    uint bias = initial_bias;

    // Do not try to decode strings longer than allowable for a domain label.
    // Non-ASCII strings are not allowed here anyway, so there is no need
    // to account for surrogates.
    if (pc.size() > MaxDomainLabelLength)
        return QString();

    // strip any ACE prefix
    int start = pc.startsWith("xn--"_L1) ? 4 : 0;
    if (!start)
        return pc;

    // find the last delimiter character '-' in the input array. copy
    // all data before this delimiter directly to the output array.
    int delimiterPos = pc.lastIndexOf(u'-');
    auto output = delimiterPos < 4 ? std::u32string()
                                   : pc.mid(start, delimiterPos - start).toStdU32String();

    // if a delimiter was found, skip to the position after it;
    // otherwise start at the front of the input string. everything
    // before the delimiter is assumed to be basic code points.
    uint cnt = delimiterPos + 1;

    // loop through the rest of the input string, inserting non-basic
    // characters into output as we go.
    while (cnt < (uint) pc.size()) {
        uint oldi = i;
        uint w = 1;

        // find the next index for inserting a non-basic character.
        for (uint k = base; cnt < (uint) pc.size(); k += base) {
            // grab a character from the punycode input and find its
            // delta digit (each digit code is part of the
            // variable-length integer delta)
            uint digit = pc.at(cnt++).unicode();
            if (digit - 48 < 10) digit -= 22;
            else if (digit - 65 < 26) digit -= 65;
            else if (digit - 97 < 26) digit -= 97;
            else digit = base;

            // Fail if the code point has no digit value
            if (digit >= base)
                return QString();

            // i = i + digit * w, fail on overflow
            uint tmp;
            if (qMulOverflow<uint>(digit, w, &tmp) || qAddOverflow<uint>(i, tmp, &i))
                return QString();

            // detect threshold to stop reading delta digits
            uint t;
            if (k <= bias) t = tmin;
            else if (k >= bias + tmax) t = tmax;
            else t = k - bias;

            if (digit < t) break;

            // w = w * (base - t), fail on overflow
            if (qMulOverflow<uint>(w, base - t, &w))
                return QString();
        }

        // find new bias and calculate the next non-basic code
        // character.
        uint outputLength = static_cast<uint>(output.length());
        bias = adapt(i - oldi, outputLength + 1, oldi == 0);

        // n = n + i div (length(output) + 1), fail on overflow
        if (qAddOverflow<uint>(n, i / (outputLength + 1), &n))
            return QString();

        // allow the deltas to wrap around
        i %= (outputLength + 1);

        // if n is a basic code point then fail; this should not happen with
        // correct implementation of Punycode, but check just n case.
        if (n < initial_n) {
            // Don't use Q_ASSERT() to avoid possibility of DoS
            qWarning("Attempt to insert a basic codepoint. Unhandled overflow?");
            return QString();
        }

        // Surrogates should normally be rejected later by other IDNA code.
        // But because of Qt's use of UTF-16 to represent strings the
        // IDNA code is not able to distinguish characters represented as pairs
        // of surrogates from normal code points. This is why surrogates are
        // not allowed here.
        //
        // Allowing surrogates would lead to non-unique (after normalization)
        // encoding of strings with non-BMP characters.
        //
        // Punycode that encodes characters outside the Unicode range is also
        // invalid and is rejected here.
        if (QChar::isSurrogate(n) || n > QChar::LastValidCodePoint)
            return QString();

        // insert the character n at position i
        output.insert(i, 1, static_cast<char32_t>(n));
        ++i;
    }

    return QString::fromStdU32String(output);
}